

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_warnings_off(APITests *this)

{
  runtime_error *this_00;
  Warning w;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  Warning local_1a0;
  
  GPIO::setwarnings(false);
  Warning::Warning(&local_1a0);
  GPIO::cleanup();
  std::__cxx11::stringbuf::str();
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  if (local_1b8 == 0) {
    Warning::~Warning(&local_1a0);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected warning occured");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_warnings_off()
    {
        GPIO::setwarnings(false);
        Warning w{};

        // cleanup() warns if no GPIOs were set up
        GPIO::cleanup();

        if (!w.contents().empty())
            throw std::runtime_error("Unexpected warning occured");
    }